

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O1

bool __thiscall gjkepa2_impl::EPA::expand(EPA *this,U pass,sSV *w,sFace *f,U e,sHorizon *horizon)

{
  uint uVar1;
  uint uVar2;
  sFace *psVar3;
  bool bVar4;
  sFace *psVar5;
  U *pUVar6;
  
  if (f->pass == pass) {
    return false;
  }
  uVar1 = expand::i1m3[e];
  if (((f->n).m_floats[2] * (w->w).m_floats[2] +
      (f->n).m_floats[0] * (w->w).m_floats[0] + (f->n).m_floats[1] * (w->w).m_floats[1]) - f->d <
      -1e-05) {
    psVar5 = newface(this,f->c[uVar1],f->c[e],w,false);
    if (psVar5 == (sFace *)0x0) {
      return false;
    }
    psVar5->e[0] = (U1)e;
    psVar5->f[0] = f;
    f->e[e] = '\0';
    f->f[e] = psVar5;
    psVar3 = horizon->cf;
    if (psVar3 == (sFace *)0x0) {
      horizon->ff = psVar5;
    }
    else {
      psVar3->e[1] = '\x02';
      psVar3->f[1] = psVar5;
      psVar5->e[2] = '\x01';
      psVar5->f[2] = psVar3;
    }
    horizon->cf = psVar5;
    pUVar6 = &horizon->nf;
  }
  else {
    uVar2 = expand::i2m3[e];
    f->pass = (U1)pass;
    bVar4 = expand(this,pass,w,f->f[uVar1],(uint)f->e[uVar1],horizon);
    if (!bVar4) {
      return false;
    }
    bVar4 = expand(this,pass,w,f->f[uVar2],(uint)f->e[uVar2],horizon);
    if (!bVar4) {
      return false;
    }
    if (f->l[1] != (sFace *)0x0) {
      f->l[1]->l[0] = f->l[0];
    }
    if (f->l[0] != (sFace *)0x0) {
      f->l[0]->l[1] = f->l[1];
    }
    if ((this->m_hull).root == f) {
      (this->m_hull).root = f->l[1];
    }
    pUVar6 = &(this->m_hull).count;
    *pUVar6 = *pUVar6 - 1;
    f->l[0] = (sFace *)0x0;
    f->l[1] = (this->m_stock).root;
    psVar5 = (this->m_stock).root;
    if (psVar5 != (sFace *)0x0) {
      psVar5->l[0] = f;
    }
    (this->m_stock).root = f;
    pUVar6 = &(this->m_stock).count;
  }
  *pUVar6 = *pUVar6 + 1;
  return true;
}

Assistant:

bool				expand(U pass,sSV* w,sFace* f,U e,sHorizon& horizon)
			{
				static const U	i1m3[]={1,2,0};
				static const U	i2m3[]={2,0,1};
				if(f->pass!=pass)
				{
					const U	e1=i1m3[e];
					if((btDot(f->n,w->w)-f->d)<-EPA_PLANE_EPS)
					{
						sFace*	nf=newface(f->c[e1],f->c[e],w,false);
						if(nf)
						{
							bind(nf,0,f,e);
							if(horizon.cf) bind(horizon.cf,1,nf,2); else horizon.ff=nf;
							horizon.cf=nf;
							++horizon.nf;
							return(true);
						}
					}
					else
					{
						const U	e2=i2m3[e];
						f->pass		=	(U1)pass;
						if(	expand(pass,w,f->f[e1],f->e[e1],horizon)&&
							expand(pass,w,f->f[e2],f->e[e2],horizon))
						{
							remove(m_hull,f);
							append(m_stock,f);
							return(true);
						}
					}
				}
				return(false);
			}